

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O0

optional<pbrt::BSDFSample> * __thiscall
pbrt::BSDF::Sample_f<pbrt::CoatedConductorBxDF>
          (BSDF *this,Vector3f woRender,Float u,Point2f u2,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Vector3f v;
  bool bVar3;
  BxDFFlags a;
  int iVar4;
  BSDF *this_00;
  BSDFSample *pBVar5;
  BxDFReflTransFlags in_ECX;
  undefined8 in_RSI;
  optional<pbrt::BSDFSample> *in_RDI;
  optional<pbrt::BSDFSample> *this_01;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  float fVar8;
  undefined1 in_ZMM3 [64];
  Vector3f VVar9;
  Tuple3<pbrt::Vector3,_float> TVar10;
  optional<pbrt::BSDFSample> bs;
  CoatedConductorBxDF *specificBxDF;
  Vector3f wo;
  BxDFReflTransFlags in_stack_00000474;
  TransportMode in_stack_00000478;
  Float in_stack_0000047c;
  LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true> *in_stack_00000480;
  Tuple2<pbrt::Point2,_float> in_stack_00000488;
  Tuple3<pbrt::Vector3,_float> in_stack_000004a0;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  SampledSpectrum *in_stack_fffffffffffffe88;
  LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true> *in_stack_fffffffffffffe90;
  BSDF *in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffed0;
  optional local_b8 [48];
  CoatedConductorBxDF *local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_50;
  float local_48;
  BxDFReflTransFlags local_44;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  undefined1 auVar6 [64];
  
  local_70 = vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = vmovlpd_avx(in_ZMM3._0_16_);
  auVar7 = ZEXT856(0);
  VVar9.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffed0;
  VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_RSI;
  local_60 = local_70;
  local_44 = in_ECX;
  local_28 = local_70;
  local_18 = local_70;
  VVar9 = RenderToLocal(in_stack_fffffffffffffeb0,VVar9);
  local_78 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar7;
  local_80 = vmovlpd_avx(auVar6._0_16_);
  local_50 = local_80;
  local_48 = local_78;
  if ((local_78 == 0.0) && (!NAN(local_78))) {
    memset(in_RDI,0,0x30);
    pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
    return in_RDI;
  }
  local_88 = TaggedPointer<pbrt::DiffuseTransmissionBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
             ::Cast<pbrt::CoatedConductorBxDF>
                       ((TaggedPointer<pbrt::DiffuseTransmissionBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                         *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  a = LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::Flags(in_stack_fffffffffffffe90)
  ;
  iVar4 = operator&(a,local_44);
  if (iVar4 == 0) {
    memset(in_RDI,0,0x30);
    pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
    return in_RDI;
  }
  LayeredBxDF<pbrt::DielectricBxDF,_pbrt::ConductorBxDF,_true>::Sample_f
            (in_stack_00000480,(Vector3f)in_stack_000004a0,in_stack_0000047c,
             (Point2f)in_stack_00000488,in_stack_00000478,in_stack_00000474);
  bVar3 = pstd::optional::operator_cast_to_bool(local_b8);
  if (bVar3) {
    this_00 = (BSDF *)pstd::optional<pbrt::BSDFSample>::operator->
                                ((optional<pbrt::BSDFSample> *)0x9b11ae);
    bVar3 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffffe88);
    if (bVar3) {
      pBVar5 = pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x9b11d2);
      if ((pBVar5->pdf != 0.0) || (NAN(pBVar5->pdf))) {
        pBVar5 = pstd::optional<pbrt::BSDFSample>::operator->
                           ((optional<pbrt::BSDFSample> *)0x9b11fe);
        fVar8 = (pBVar5->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x9b127f);
          this_01 = (optional<pbrt::BSDFSample> *)0x0;
          v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffed0;
          v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_RSI;
          v.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)in_RSI >> 0x20);
          TVar10 = (Tuple3<pbrt::Vector3,_float>)LocalToRender(this_00,v);
          fVar8 = TVar10.z;
          auVar2._8_8_ = this_01;
          auVar2._0_8_ = TVar10._0_8_;
          uVar1 = vmovlpd_avx(auVar2);
          pBVar5 = pstd::optional<pbrt::BSDFSample>::operator->
                             ((optional<pbrt::BSDFSample> *)0x9b1314);
          (pBVar5->wi).super_Tuple3<pbrt::Vector3,_float>.z = fVar8;
          (pBVar5->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
          (pBVar5->wi).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
          pstd::optional<pbrt::BSDFSample>::optional(this_01,TVar10._0_8_);
          goto LAB_009b1353;
        }
      }
    }
  }
  memset(in_RDI,0,0x30);
  pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
LAB_009b1353:
  pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x9b1360);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<BSDFSample> Sample_f(
        Vector3f woRender, Float u, Point2f u2,
        TransportMode mode = TransportMode::Radiance,
        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        Vector3f wo = RenderToLocal(woRender);
        if (wo.z == 0)
            return {};

        const BxDF *specificBxDF = bxdf.Cast<BxDF>();
        if (!(specificBxDF->Flags() & sampleFlags))
            return {};

        pstd::optional<BSDFSample> bs =
            specificBxDF->Sample_f(wo, u, u2, mode, sampleFlags);
        if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
            return {};
        DCHECK_GT(bs->pdf, 0);

        PBRT_DBG("For wo = (%f, %f, %f) ns %f %f %f sampled f = %f %f %f %f, pdf = %f, "
                 "ratio[0] = %f wi = (%f, %f, %f)\n",
                 wo.x, wo.y, wo.z, shadingFrame.z.x, shadingFrame.z.y, shadingFrame.z.z,
                 bs->f[0], bs->f[1], bs->f[2], bs->f[3], bs->pdf,
                 (bs->pdf > 0) ? (bs->f[0] / bs->pdf) : 0, bs->wi.x, bs->wi.y, bs->wi.z);

        bs->wi = LocalToRender(bs->wi);

        return bs;
    }